

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zg.cc
# Opt level: O1

void __thiscall
tchecker::zg::zg_t::split
          (zg_t *this,const_state_sptr_t *s,clock_constraint_container_t *constraints,
          vector<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>_>_>
          *v)

{
  value_type *pvVar1;
  value_type *pvVar2;
  vector<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>_>_>
  *this_00;
  state_sptr_t *split_s;
  value_type *__x;
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>
  *this_01;
  pointer c;
  vector<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>_>_>
  done;
  queue<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_std::deque<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>_>_>_>
  todo;
  undefined1 local_c0 [16];
  value_type *pvStack_b0;
  size_t local_a8;
  vector<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>_>_>
  *local_a0;
  pointer local_98;
  value_type *local_90;
  _Deque_base<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>_>_>
  local_88;
  
  local_c0._8_8_ = (value_type *)0x0;
  pvStack_b0 = (value_type *)0x0;
  local_a8 = 0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::
  _Deque_base<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>_>_>
  ::_M_initialize_map(&local_88,0);
  if (s->_t == (make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL> *)0x0) {
    __assert_fail("_t != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/utils/shared_objects.hh"
                  ,0x1d0,
                  "T &tchecker::intrusive_shared_ptr_t<const tchecker::make_shared_t<tchecker::zg::state_t>>::operator*() const [T = const tchecker::make_shared_t<tchecker::zg::state_t>]"
                 );
  }
  details::
  state_pool_allocator_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>::
  construct_from_state<>
            ((state_pool_allocator_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>
              *)local_c0,
             (make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL> *)&this->_state_allocator);
  local_a0 = v;
  std::
  deque<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,unsigned_long,1ul>>,std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,unsigned_long,1ul>>>>
  ::
  emplace_back<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,unsigned_long,1ul>>>
            ((deque<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,unsigned_long,1ul>>,std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,unsigned_long,1ul>>>>
              *)&local_88,
             (intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>
              *)local_c0);
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>::
  ~intrusive_shared_ptr_t
            ((intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>
              *)local_c0);
  c = (constraints->
      super__Vector_base<tchecker::clock_constraint_t,_std::allocator<tchecker::clock_constraint_t>_>
      )._M_impl.super__Vector_impl_data._M_start;
  local_98 = (constraints->
             super__Vector_base<tchecker::clock_constraint_t,_std::allocator<tchecker::clock_constraint_t>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  if (c != local_98) {
    do {
      while (pvVar1 = pvStack_b0, __x = (value_type *)local_c0._8_8_,
            local_88._M_impl.super__Deque_impl_data._M_finish._M_cur !=
            local_88._M_impl.super__Deque_impl_data._M_start._M_cur) {
        local_c0._0_8_ = (make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL> *)0x0;
        intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>
        ::reset((intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>
                 *)local_c0,
                (make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL> *)
                ((__shared_ptr<tchecker::collectable_t,_(__gnu_cxx::_Lock_policy)2> *)
                &(local_88._M_impl.super__Deque_impl_data._M_start._M_cur)->_t)->_M_ptr);
        split(this,(intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>
                    *)local_c0,c,
              (vector<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>_>_>
               *)(local_c0 + 8));
        intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>
        ::~intrusive_shared_ptr_t
                  ((intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>
                    *)local_c0);
        std::
        deque<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>_>_>
        ::pop_front((deque<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>_>_>
                     *)&local_88);
      }
      for (; pvVar2 = pvStack_b0, __x != pvVar1; __x = __x + 1) {
        std::
        deque<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>_>_>
        ::push_back((deque<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>_>_>
                     *)&local_88,__x);
      }
      if (pvStack_b0 != (value_type *)local_c0._8_8_) {
        local_90 = (value_type *)local_c0._8_8_;
        this_01 = (intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>
                   *)local_c0._8_8_;
        do {
          intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>
          ::~intrusive_shared_ptr_t(this_01);
          this_01 = this_01 + 1;
        } while (this_01 != pvVar2);
        pvStack_b0 = local_90;
      }
      c = c + 1;
    } while (c != local_98);
  }
  this_00 = local_a0;
  if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      local_88._M_impl.super__Deque_impl_data._M_start._M_cur) {
    do {
      std::
      vector<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>_>_>
      ::push_back(this_00,local_88._M_impl.super__Deque_impl_data._M_start._M_cur);
      std::
      deque<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>_>_>
      ::pop_front((deque<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>_>_>
                   *)&local_88);
    } while (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             local_88._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  std::
  deque<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>_>_>
  ::~deque((deque<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>_>_>
            *)&local_88);
  std::
  vector<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>_>_>
  ::~vector((vector<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>_>_>
             *)(local_c0 + 8));
  return;
}

Assistant:

void zg_t::split(tchecker::zg::const_state_sptr_t const & s, tchecker::clock_constraint_container_t const & constraints,
                 std::vector<tchecker::zg::state_sptr_t> & v)
{
  std::vector<tchecker::zg::state_sptr_t> done;
  std::queue<tchecker::zg::state_sptr_t> todo;

  todo.push(_state_allocator.clone(*s));
  for (tchecker::clock_constraint_t const & c : constraints) {
    while (!todo.empty()) {
      split(tchecker::zg::const_state_sptr_t{todo.front()}, c, done);
      todo.pop();
    }
    for (tchecker::zg::state_sptr_t const & split_s : done)
      todo.push(split_s);
    done.clear();
  }

  for (; !todo.empty(); todo.pop())
    v.push_back(todo.front());
}